

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_unsigned_char>::operator<
          (ArrayPtr<const_unsigned_char> *this,ArrayPtr<const_unsigned_char> *other)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  ulong __n;
  
  uVar1 = this->size_;
  uVar2 = other->size_;
  __n = uVar2;
  if (uVar1 < uVar2) {
    __n = uVar1;
  }
  iVar3 = memcmp(this->ptr,other->ptr,__n);
  bVar4 = iVar3 < 0;
  if (iVar3 == 0) {
    bVar4 = uVar1 < uVar2;
  }
  return bVar4;
}

Assistant:

inline constexpr bool operator<(const ArrayPtr& other) const {
    size_t comparisonSize = kj::min(size_, other.size_);
    if constexpr (isSameType<RemoveConst<T>, char>() || isSameType<RemoveConst<T>, unsigned char>()) {
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
      int ret = __builtin_memcmp(ptr, other.ptr, comparisonSize * sizeof(T));
      if (ret != 0) {
        return ret < 0;
      }
#else
      for (size_t i = 0; i < comparisonSize; ++i) {
        if (static_cast<unsigned char>(ptr[i]) != static_cast<unsigned char>(other.ptr[i])) {
          return static_cast<unsigned char>(ptr[i]) < static_cast<unsigned char>(other.ptr[i]);
        }
      }
#endif
    } else {
      for (size_t i = 0; i < comparisonSize; i++) {
        bool ret = ptr[i] == other.ptr[i];
        if (!ret) {
          return ptr[i] < other.ptr[i];
        }
      }
    }
    // arrays are equal up to comparisonSize
    return size_ < other.size_;
  }